

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O1

void __thiscall
OpenMD::NameFinder::matchTorsion
          (NameFinder *this,string *molName,string *torsionName,SelectionSet *bs)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  torsionNodes;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  molNodes;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  torsionAtomNodes;
  TreeNodePtr local_b0;
  TreeNodePtr local_a0;
  TreeNodePtr local_90;
  string *local_80;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  local_78;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  local_60;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  local_48;
  
  local_90.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_90.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_90.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_90.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_90.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_80 = torsionName;
  getMatchedChildren(&local_60,(NameFinder *)molName,&local_90,molName);
  if (local_90.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_60.
      super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = local_60.
             super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_a0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar1->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_a0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (psVar1->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_a0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_a0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_a0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      getMatchedChildren(&local_78,(NameFinder *)molName,&local_a0,local_80);
      psVar3 = local_78.
               super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_a0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        psVar3 = local_78.
                 super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      for (; psVar3 != local_78.
                       super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; psVar3 = psVar3 + 1) {
        local_b0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (psVar3->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_b0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (psVar3->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
        if (local_b0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_b0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_b0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_b0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_b0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        getAllChildren(&local_48,(NameFinder *)molName,&local_b0);
        psVar2 = local_48.
                 super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_b0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          psVar2 = local_48.
                   super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        for (; psVar2 != local_48.
                         super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
          molName = (string *)
                    &((psVar2->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->bs;
          SelectionSet::orOperator(bs,(SelectionSet *)molName);
        }
        std::
        vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
        ::~vector(&local_48);
      }
      std::
      vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
      ::~vector(&local_78);
      psVar1 = psVar1 + 1;
    } while (psVar1 != local_60.
                       super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
  ~vector(&local_60);
  return;
}

Assistant:

void NameFinder::matchTorsion(const std::string& molName,
                                const std::string& torsionName,
                                SelectionSet& bs) {
    std::vector<TreeNodePtr> molNodes = getMatchedChildren(root_, molName);
    std::vector<TreeNodePtr>::iterator i;
    for (i = molNodes.begin(); i != molNodes.end(); ++i) {
      std::vector<TreeNodePtr> torsionNodes =
          getMatchedChildren(*i, torsionName);
      std::vector<TreeNodePtr>::iterator j;
      for (j = torsionNodes.begin(); j != torsionNodes.end(); ++j) {
        std::vector<TreeNodePtr> torsionAtomNodes = getAllChildren(*j);
        std::vector<TreeNodePtr>::iterator k;
        for (k = torsionAtomNodes.begin(); k != torsionAtomNodes.end(); ++k) {
          bs |= (*k)->bs;
        }
      }
    }
  }